

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_pronunciation.c
# Opt level: O3

void njd_set_pronunciation(NJD *njd)

{
  int iVar1;
  int size;
  char *pcVar2;
  size_t sVar3;
  NJDNode *pNVar4;
  char *pcVar5;
  char cVar6;
  char **ppcVar7;
  NJDNode *node;
  long lVar8;
  long lVar9;
  NJDNode *pNVar10;
  
  for (pNVar10 = njd->head; pNVar10 != (NJDNode *)0x0; pNVar10 = pNVar10->next) {
    iVar1 = NJDNode_get_mora_size(pNVar10);
    if (iVar1 == 0) {
      NJDNode_set_read(pNVar10,(char *)0x0);
      NJDNode_set_pron(pNVar10,(char *)0x0);
      pcVar2 = NJDNode_get_string(pNVar10);
      sVar3 = strlen(pcVar2);
      if (0 < (int)sVar3) {
        iVar1 = 0;
        do {
          lVar8 = 0;
          pcVar5 = anon_var_dwarf_12746a;
          do {
            cVar6 = *pcVar5;
            if (cVar6 != '\0') {
              lVar9 = 0;
              do {
                if (pcVar2[lVar9 + iVar1] != cVar6) goto LAB_00148419;
                cVar6 = pcVar5[lVar9 + 1];
                lVar9 = lVar9 + 1;
              } while (cVar6 != '\0');
              if (0 < (int)lVar9) {
                pcVar5 = njd_set_pronunciation_list[(int)lVar8 + 1];
                NJDNode_add_read(pNVar10,pcVar5);
                NJDNode_add_pron(pNVar10,pcVar5);
                size = atoi(njd_set_pronunciation_list[(int)lVar8 + 2]);
                NJDNode_add_mora_size(pNVar10,size);
                goto LAB_0014847a;
              }
            }
LAB_00148419:
            pcVar5 = njd_set_pronunciation_list[lVar8 + 3];
            lVar8 = lVar8 + 3;
          } while (pcVar5 != (char *)0x0);
          lVar9 = 1;
LAB_0014847a:
          iVar1 = iVar1 + (int)lVar9;
        } while (iVar1 < (int)sVar3);
      }
      iVar1 = NJDNode_get_mora_size(pNVar10);
      if (iVar1 != 0) {
        NJDNode_set_pos(pNVar10,anon_var_dwarf_1273a7);
        NJDNode_set_pos_group1(pNVar10,(char *)0x0);
        NJDNode_set_pos_group2(pNVar10,(char *)0x0);
        NJDNode_set_pos_group3(pNVar10,(char *)0x0);
      }
      pcVar5 = NJDNode_get_orig(pNVar10);
      if ((*pcVar5 == '*') && (pcVar5[1] == '\0')) {
        NJDNode_set_orig(pNVar10,pcVar2);
      }
      pcVar2 = NJDNode_get_pron(pNVar10);
      if ((*pcVar2 == '*') && (pcVar2[1] == '\0')) {
        pcVar2 = NJDNode_get_string(pNVar10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_1d7c);
        if (iVar1 == 0) {
          NJDNode_set_read(pNVar10,anon_var_dwarf_1d7c);
          NJDNode_set_pron(pNVar10,anon_var_dwarf_1d7c);
        }
      }
      pcVar2 = NJDNode_get_pron(pNVar10);
      if ((*pcVar2 == '*') && (pcVar2[1] == '\0')) {
        NJDNode_set_read(pNVar10,anon_var_dwarf_2546);
        NJDNode_set_pron(pNVar10,anon_var_dwarf_2546);
        NJDNode_set_pos(pNVar10,anon_var_dwarf_1273ee);
      }
    }
  }
  NJD_remove_silent_node(njd);
  pNVar10 = njd->head;
  if (pNVar10 != (NJDNode *)0x0) {
    node = (NJDNode *)0x0;
    do {
      pcVar2 = NJDNode_get_pos(pNVar10);
      iVar1 = strcmp(pcVar2,anon_var_dwarf_1273a7);
      if (iVar1 == 0) {
        ppcVar7 = njd_set_pronunciation_list;
        pcVar2 = anon_var_dwarf_12746a;
        do {
          ppcVar7 = ppcVar7 + 3;
          pcVar5 = NJDNode_get_string(pNVar10);
          iVar1 = strcmp(pcVar5,pcVar2);
          if (iVar1 == 0) {
            pNVar4 = pNVar10;
            if (node != (NJDNode *)0x0) {
              pcVar2 = NJDNode_get_string(pNVar10);
              NJDNode_add_string(node,pcVar2);
              pcVar2 = NJDNode_get_orig(pNVar10);
              NJDNode_add_orig(node,pcVar2);
              pcVar2 = NJDNode_get_read(pNVar10);
              NJDNode_add_read(node,pcVar2);
              pcVar2 = NJDNode_get_pron(pNVar10);
              NJDNode_add_pron(node,pcVar2);
              iVar1 = NJDNode_get_mora_size(pNVar10);
              NJDNode_add_mora_size(node,iVar1);
              NJDNode_set_pron(pNVar10,(char *)0x0);
              pNVar4 = node;
            }
            goto LAB_001485e9;
          }
          pcVar2 = *ppcVar7;
        } while (pcVar2 != (char *)0x0);
      }
      pNVar4 = (NJDNode *)0x0;
LAB_001485e9:
      pNVar10 = pNVar10->next;
      node = pNVar4;
    } while (pNVar10 != (_NJDNode *)0x0);
  }
  NJD_remove_silent_node(njd);
  pNVar10 = njd->head;
  do {
    if ((pNVar10 == (NJDNode *)0x0) || (pNVar10->next == (NJDNode *)0x0)) {
      return;
    }
    pcVar2 = NJDNode_get_pron(pNVar10->next);
    iVar1 = strcmp(pcVar2,anon_var_dwarf_2690);
    if (iVar1 == 0) {
      pcVar2 = NJDNode_get_pos(pNVar10->next);
      iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
      if (iVar1 == 0) {
        pcVar2 = NJDNode_get_pos(pNVar10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12d24d + 3);
        if (iVar1 != 0) {
          pcVar2 = NJDNode_get_pos(pNVar10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
          if (iVar1 != 0) goto LAB_001486e8;
        }
        iVar1 = NJDNode_get_mora_size(pNVar10);
        if (0 < iVar1) {
          NJDNode_set_pron(pNVar10->next,anon_var_dwarf_12a3ec + 6);
        }
      }
    }
LAB_001486e8:
    if (pNVar10->next == (_NJDNode *)0x0) {
      return;
    }
    pcVar2 = NJDNode_get_pos(pNVar10);
    iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
    if (iVar1 == 0) {
      pcVar2 = NJDNode_get_string(pNVar10->next);
      iVar1 = strcmp(pcVar2,anon_var_dwarf_1d7c);
      if (iVar1 == 0) {
        pcVar2 = NJDNode_get_string(pNVar10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_127442);
        pcVar2 = anon_var_dwarf_12e7be;
        if (iVar1 != 0) {
          pcVar2 = NJDNode_get_string(pNVar10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_127456);
          pcVar2 = anon_var_dwarf_12e7df;
          if (iVar1 != 0) goto LAB_0014876a;
        }
        NJDNode_set_pron(pNVar10,pcVar2 + 9);
      }
    }
LAB_0014876a:
    pNVar10 = pNVar10->next;
  } while( true );
}

Assistant:

void njd_set_pronunciation(NJD * njd)
{
   NJDNode *node;
   const char *str;
   int i, j = 0;
   int pos;
   int len;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_mora_size(node) == 0) {
         NJDNode_set_read(node, NULL);
         NJDNode_set_pron(node, NULL);
         /* if the word is kana, set them as filler */
         {
            str = NJDNode_get_string(node);
            len = strlen(str);
            for (pos = 0; pos < len;) {
               for (i = 0, j = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
                  j = strtopcmp(&str[pos], njd_set_pronunciation_list[i]);
                  if (j > 0)
                     break;
               }
               if (j > 0) {
                  pos += j;
                  NJDNode_add_read(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_pron(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_mora_size(node, atoi(njd_set_pronunciation_list[i + 2]));
               } else {
                  pos++;
               }
            }
            /* if filler, overwrite pos */
            if (NJDNode_get_mora_size(node) != 0) {
               NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_FILLER);
               NJDNode_set_pos_group1(node, NULL);
               NJDNode_set_pos_group2(node, NULL);
               NJDNode_set_pos_group3(node, NULL);
            }
            if (strcmp(NJDNode_get_orig(node), "*") == 0) {
               NJDNode_set_orig(node, str);
            }
         }
         /* if known symbol, set the pronunciation */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            for (i = 0; njd_set_pronunciation_symbol_list[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_symbol_list[i]) == 0) {
                  NJDNode_set_read(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  NJDNode_set_pron(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  break;
               }
            }
         }
         /* if the word is not kana, set pause symbol */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            NJDNode_set_read(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_KIGOU);
         }
      }
   }
   NJD_remove_silent_node(njd);

   /* chain kana sequence */
   {
      NJDNode *head_of_kana_filler_sequence = NULL;
      int find;
      for (node = njd->head; node != NULL; node = node->next) {
         if (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_FILLER) == 0) {
            find = 0;
            for (i = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_list[i]) == 0) {
                  find = 1;
                  if (head_of_kana_filler_sequence == NULL) {
                     head_of_kana_filler_sequence = node;
                  } else {
                     NJDNode_add_string(head_of_kana_filler_sequence, NJDNode_get_string(node));
                     NJDNode_add_orig(head_of_kana_filler_sequence, NJDNode_get_orig(node));
                     NJDNode_add_read(head_of_kana_filler_sequence, NJDNode_get_read(node));
                     NJDNode_add_pron(head_of_kana_filler_sequence, NJDNode_get_pron(node));
                     NJDNode_add_mora_size(head_of_kana_filler_sequence,
                                           NJDNode_get_mora_size(node));
                     NJDNode_set_pron(node, NULL);
                  }
                  break;
               }
            }
            if (find == 0) {
               head_of_kana_filler_sequence = NULL;
            }
         } else {
            head_of_kana_filler_sequence = NULL;
         }
      }
   }
   NJD_remove_silent_node(njd);

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL
          && strcmp(NJDNode_get_pron(node->next), NJD_SET_PRONUNCIATION_U) == 0
          && strcmp(NJDNode_get_pos(node->next), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_DOUSHI) == 0
              || strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0)
          && NJDNode_get_mora_size(node) > 0) {
         NJDNode_set_pron(node->next, NJD_SET_PRONUNCIATION_CHOUON);
      }
      if (node->next != NULL
          && strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && strcmp(NJDNode_get_string(node->next), NJD_SET_PRONUNCIATION_QUESTION) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_DESU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_DESU_PRON);
         else if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_MASU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_MASU_PRON);
      }
   }
}